

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O0

void __thiscall QMdiSubWindowPrivate::updateInternalWindowTitle(QMdiSubWindowPrivate *this)

{
  long lVar1;
  bool bVar2;
  int aw;
  QMdiSubWindowPrivate *in_RDI;
  long in_FS_OFFSET;
  QLatin1StringView QVar3;
  QMdiSubWindow *q;
  QString *in_stack_ffffffffffffff58;
  QString *in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  QString *in_stack_ffffffffffffff70;
  undefined1 auVar4 [12];
  undefined1 in_stack_ffffffffffffff90 [16];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  q_func(in_RDI);
  bVar2 = QWidget::isWindowModified((QWidget *)0x632b5f);
  if (bVar2) {
    QWidget::windowTitle((QWidget *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    QString::operator=(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    QString::~QString((QString *)0x632ba0);
    in_stack_ffffffffffffff70 = &in_RDI->windowTitle;
    QVar3 = Qt::Literals::StringLiterals::operator____L1
                      ((char *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                       (size_t)in_stack_ffffffffffffff60);
    auVar4 = QVar3._0_12_;
    Qt::Literals::StringLiterals::operator____L1
              ((char *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
               (size_t)in_stack_ffffffffffffff60);
    QString::replace((QLatin1String *)in_stack_ffffffffffffff70,auVar4._0_8_,auVar4._8_4_);
  }
  else {
    QWidget::windowTitle((QWidget *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    qt_setWindowTitle_helperHelper(in_stack_ffffffffffffff90._8_8_,in_stack_ffffffffffffff90._0_8_);
    QString::operator=(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    QString::~QString((QString *)0x632c4f);
    QString::~QString((QString *)0x632c59);
  }
  aw = QWidget::width((QWidget *)0x632c68);
  titleBarHeight(in_RDI);
  QWidget::update((QWidget *)in_RDI,(int)((ulong)in_stack_ffffffffffffff70 >> 0x20),
                  (int)in_stack_ffffffffffffff70,aw,in_stack_ffffffffffffff68);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMdiSubWindowPrivate::updateInternalWindowTitle()
{
    Q_Q(QMdiSubWindow);
    if (q->isWindowModified()) {
        windowTitle = q->windowTitle();
        windowTitle.replace("[*]"_L1, "*"_L1);
    } else {
        windowTitle = qt_setWindowTitle_helperHelper(q->windowTitle(), q);
    }
    q->update(0, 0, q->width(), titleBarHeight());
}